

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t cab_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  ssize_t sVar1;
  void *pvVar2;
  archive_read *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  ssize_t bytes_avail;
  cab *cab;
  long local_38;
  ssize_t *avail;
  wchar_t local_4;
  
  avail = *(ssize_t **)in_RDI[0x15].archive_format_name;
  if (avail[1] == 0) {
    *in_RSI = 0;
    *in_RDX = 0;
    sVar1 = *avail;
    (in_RCX->archive).magic = (int)sVar1;
    (in_RCX->archive).state = (int)((ulong)sVar1 >> 0x20);
    *(undefined1 *)((long)avail + 0x92) = 1;
    local_4 = L'\0';
  }
  else {
    pvVar2 = cab_read_ahead_cfdata(in_RCX,avail);
    *in_RSI = pvVar2;
    if (local_38 < 1) {
      *in_RSI = 0;
      *in_RDX = 0;
      (in_RCX->archive).magic = 0;
      (in_RCX->archive).state = 0;
      if ((local_38 == 0) && (*(short *)(avail[7] + 8) == 0)) {
        archive_set_error(in_RDI,0x54,"Invalid CFDATA");
        local_4 = L'\xffffffe2';
      }
      else {
        local_4 = (wchar_t)local_38;
      }
    }
    else {
      if (avail[1] < local_38) {
        local_38 = avail[1];
      }
      *in_RDX = local_38;
      sVar1 = *avail;
      (in_RCX->archive).magic = (int)sVar1;
      (in_RCX->archive).state = (int)((ulong)sVar1 >> 0x20);
      *avail = local_38 + *avail;
      avail[1] = avail[1] - local_38;
      if (avail[1] == 0) {
        *(undefined1 *)((long)avail + 0x92) = 1;
      }
      avail[2] = local_38;
      if ((*(short *)(avail[5] + 6) == 0) && (avail[2] < *(long *)(avail[7] + 0x10))) {
        *(ssize_t *)(avail[7] + 0x10) = avail[2];
      }
      local_4 = L'\0';
    }
  }
  return local_4;
}

Assistant:

static int
cab_read_data(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct cab *cab = (struct cab *)(a->format->data);
	ssize_t bytes_avail;

	if (cab->entry_bytes_remaining == 0) {
		*buff = NULL;
		*size = 0;
		*offset = cab->entry_offset;
		cab->end_of_entry = 1;
		return (ARCHIVE_OK);
	}

	*buff = cab_read_ahead_cfdata(a, &bytes_avail);
	if (bytes_avail <= 0) {
		*buff = NULL;
		*size = 0;
		*offset = 0;
		if (bytes_avail == 0 &&
		    cab->entry_cfdata->uncompressed_size == 0) {
			/* All of CFDATA in a folder has been handled. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT, "Invalid CFDATA");
			return (ARCHIVE_FATAL);
		} else
			return ((int)bytes_avail);
	}
	if (bytes_avail > cab->entry_bytes_remaining)
		bytes_avail = (ssize_t)cab->entry_bytes_remaining;

	*size = bytes_avail;
	*offset = cab->entry_offset;
	cab->entry_offset += bytes_avail;
	cab->entry_bytes_remaining -= bytes_avail;
	if (cab->entry_bytes_remaining == 0)
		cab->end_of_entry = 1;
	cab->entry_unconsumed = bytes_avail;
	if (cab->entry_cffolder->comptype == COMPTYPE_NONE) {
		/* Don't consume more than current entry used. */
		if (cab->entry_cfdata->unconsumed > cab->entry_unconsumed)
			cab->entry_cfdata->unconsumed = cab->entry_unconsumed;
	}
	return (ARCHIVE_OK);
}